

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asynclog.cpp
# Opt level: O2

void __thiscall AsyncLog::ThreadFunc(AsyncLog *this)

{
  vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
  *this_00;
  BufferPtr *this_01;
  BufferPtr *this_02;
  pointer puVar1;
  LogFile *pLVar2;
  FixedBuffer<4096UL> *data;
  __uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_> data_00;
  __uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_> *p_Var3;
  pointer puVar4;
  BufferPtr BVar5;
  size_t i;
  ulong uVar6;
  size_t i_1;
  LockGuard lock;
  BufferPtr secondBuffer;
  BufferPtr firstBuffer;
  vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
  local_48;
  
  firstBuffer._M_t.
  super___uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>._M_t.
  super__Tuple_impl<0UL,_FixedBuffer<4096UL>_*,_std::default_delete<FixedBuffer<4096UL>_>_>.
  super__Head_base<0UL,_FixedBuffer<4096UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>,_true,_true>)
       operator_new(0x1008);
  *(undefined8 *)
   ((long)firstBuffer._M_t.
          super___uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>.
          _M_t.
          super__Tuple_impl<0UL,_FixedBuffer<4096UL>_*,_std::default_delete<FixedBuffer<4096UL>_>_>.
          super__Head_base<0UL,_FixedBuffer<4096UL>_*,_false>._M_head_impl + 0x1000) = 0;
  secondBuffer._M_t.
  super___uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>._M_t.
  super__Tuple_impl<0UL,_FixedBuffer<4096UL>_*,_std::default_delete<FixedBuffer<4096UL>_>_>.
  super__Head_base<0UL,_FixedBuffer<4096UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>,_true,_true>)
       operator_new(0x1008);
  *(undefined8 *)
   ((long)secondBuffer._M_t.
          super___uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>.
          _M_t.
          super__Tuple_impl<0UL,_FixedBuffer<4096UL>_*,_std::default_delete<FixedBuffer<4096UL>_>_>.
          super__Head_base<0UL,_FixedBuffer<4096UL>_*,_false>._M_head_impl + 0x1000) = 0;
  local_48.
  super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
  ::reserve(&local_48,0x10);
  LockGuard::LockGuard
            (&lock,(this->m_mutex)._M_t.super___uniq_ptr_impl<Mutex,_std::default_delete<Mutex>_>.
                   _M_t.super__Tuple_impl<0UL,_Mutex_*,_std::default_delete<Mutex>_>.
                   super__Head_base<0UL,_Mutex_*,_false>._M_head_impl);
  Condition::Notify((this->m_mainThreadRunCond)._M_t.
                    super___uniq_ptr_impl<Condition,_std::default_delete<Condition>_>._M_t.
                    super__Tuple_impl<0UL,_Condition_*,_std::default_delete<Condition>_>.
                    super__Head_base<0UL,_Condition_*,_false>._M_head_impl);
  LockGuard::~LockGuard(&lock);
  this_00 = &this->m_buffers;
  this_01 = &this->m_curBuff;
  this_02 = &this->m_nextBuff;
  while (this->m_bRunning == true) {
    LockGuard::LockGuard
              (&lock,(this->m_mutex)._M_t.super___uniq_ptr_impl<Mutex,_std::default_delete<Mutex>_>.
                     _M_t.super__Tuple_impl<0UL,_Mutex_*,_std::default_delete<Mutex>_>.
                     super__Head_base<0UL,_Mutex_*,_false>._M_head_impl);
    if ((this->m_buffers).
        super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->m_buffers).
        super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      Condition::WaitForSeconds
                ((this->m_subThreadFlushCond)._M_t.
                 super___uniq_ptr_impl<Condition,_std::default_delete<Condition>_>._M_t.
                 super__Tuple_impl<0UL,_Condition_*,_std::default_delete<Condition>_>.
                 super__Head_base<0UL,_Condition_*,_false>._M_head_impl,3.0);
    }
    std::
    vector<std::unique_ptr<FixedBuffer<4096ul>,std::default_delete<FixedBuffer<4096ul>>>,std::allocator<std::unique_ptr<FixedBuffer<4096ul>,std::default_delete<FixedBuffer<4096ul>>>>>
    ::emplace_back<std::unique_ptr<FixedBuffer<4096ul>,std::default_delete<FixedBuffer<4096ul>>>>
              ((vector<std::unique_ptr<FixedBuffer<4096ul>,std::default_delete<FixedBuffer<4096ul>>>,std::allocator<std::unique_ptr<FixedBuffer<4096ul>,std::default_delete<FixedBuffer<4096ul>>>>>
                *)this_00,this_01);
    BVar5 = firstBuffer;
    firstBuffer._M_t.
    super___uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>._M_t.
    super__Tuple_impl<0UL,_FixedBuffer<4096UL>_*,_std::default_delete<FixedBuffer<4096UL>_>_>.
    super__Head_base<0UL,_FixedBuffer<4096UL>_*,_false>._M_head_impl =
         (__uniq_ptr_data<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>,_true,_true>
          )(__uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>)0x0;
    std::__uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>::reset
              ((__uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_> *)
               this_01,(pointer)BVar5._M_t.
                                super___uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_FixedBuffer<4096UL>_*,_std::default_delete<FixedBuffer<4096UL>_>_>
                                .super__Head_base<0UL,_FixedBuffer<4096UL>_*,_false>._M_head_impl);
    BVar5 = secondBuffer;
    ((this_01->_M_t).
     super___uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>._M_t.
     super__Tuple_impl<0UL,_FixedBuffer<4096UL>_*,_std::default_delete<FixedBuffer<4096UL>_>_>.
     super__Head_base<0UL,_FixedBuffer<4096UL>_*,_false>._M_head_impl)->m_pos = 0;
    if ((this_02->_M_t).
        super___uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>._M_t.
        super__Tuple_impl<0UL,_FixedBuffer<4096UL>_*,_std::default_delete<FixedBuffer<4096UL>_>_>.
        super__Head_base<0UL,_FixedBuffer<4096UL>_*,_false>._M_head_impl ==
        (FixedBuffer<4096UL> *)0x0) {
      secondBuffer._M_t.
      super___uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>._M_t.
      super__Tuple_impl<0UL,_FixedBuffer<4096UL>_*,_std::default_delete<FixedBuffer<4096UL>_>_>.
      super__Head_base<0UL,_FixedBuffer<4096UL>_*,_false>._M_head_impl =
           (__uniq_ptr_data<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>,_true,_true>
            )(__uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>)0x0;
      std::__uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>::reset
                ((__uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_> *
                 )this_02,(pointer)BVar5._M_t.
                                   super___uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_FixedBuffer<4096UL>_*,_std::default_delete<FixedBuffer<4096UL>_>_>
                                   .super__Head_base<0UL,_FixedBuffer<4096UL>_*,_false>._M_head_impl
                );
      ((this_02->_M_t).
       super___uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>._M_t.
       super__Tuple_impl<0UL,_FixedBuffer<4096UL>_*,_std::default_delete<FixedBuffer<4096UL>_>_>.
       super__Head_base<0UL,_FixedBuffer<4096UL>_*,_false>._M_head_impl)->m_pos = 0;
    }
    puVar1 = (this->m_buffers).
             super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->m_buffers).
    super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_48.
         super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    p_Var3 = (__uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_> *)
             (this->m_buffers).
             super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar4 = (this->m_buffers).
             super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    (this->m_buffers).
    super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_48.
         super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->m_buffers).
    super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_48.
         super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_48.
    super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var3;
    local_48.
    super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar4;
    local_48.
    super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = puVar1;
    std::
    vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
    ::clear(this_00);
    LockGuard::~LockGuard(&lock);
    for (uVar6 = 0;
        uVar6 < (ulong)((long)local_48.
                              super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_48.
                              super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3); uVar6 = uVar6 + 1) {
      pLVar2 = (this->m_logFilePtr)._M_t.
               super___uniq_ptr_impl<LogFile,_std::default_delete<LogFile>_>._M_t.
               super__Tuple_impl<0UL,_LogFile_*,_std::default_delete<LogFile>_>.
               super__Head_base<0UL,_LogFile_*,_false>._M_head_impl;
      data = (((__uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_> *)
              (local_48.
               super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar6))->_M_t).
             super__Tuple_impl<0UL,_FixedBuffer<4096UL>_*,_std::default_delete<FixedBuffer<4096UL>_>_>
             .super__Head_base<0UL,_FixedBuffer<4096UL>_*,_false>._M_head_impl;
      data->m_buff[data->m_pos] = '\0';
      LogFile::Append(pLVar2,data->m_buff,
                      ((((__uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>
                          *)(local_48.
                             super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar6))->_M_t).
                       super__Tuple_impl<0UL,_FixedBuffer<4096UL>_*,_std::default_delete<FixedBuffer<4096UL>_>_>
                       .super__Head_base<0UL,_FixedBuffer<4096UL>_*,_false>._M_head_impl)->m_pos);
    }
    std::__uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>::operator=
              ((__uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_> *)
               &firstBuffer,
               (__uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_> *)
               local_48.
               super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    if (8 < (ulong)((long)local_48.
                          super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_48.
                         super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)) {
      std::__uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>::
      operator=((__uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_> *)
                &secondBuffer,
                (__uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_> *)
                (local_48.
                 super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1));
    }
    std::
    vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
    ::clear(&local_48);
    LogFile::Flush((this->m_logFilePtr)._M_t.
                   super___uniq_ptr_impl<LogFile,_std::default_delete<LogFile>_>._M_t.
                   super__Tuple_impl<0UL,_LogFile_*,_std::default_delete<LogFile>_>.
                   super__Head_base<0UL,_LogFile_*,_false>._M_head_impl);
  }
  LockGuard::LockGuard
            (&lock,(this->m_mutex)._M_t.super___uniq_ptr_impl<Mutex,_std::default_delete<Mutex>_>.
                   _M_t.super__Tuple_impl<0UL,_Mutex_*,_std::default_delete<Mutex>_>.
                   super__Head_base<0UL,_Mutex_*,_false>._M_head_impl);
  std::
  vector<std::unique_ptr<FixedBuffer<4096ul>,std::default_delete<FixedBuffer<4096ul>>>,std::allocator<std::unique_ptr<FixedBuffer<4096ul>,std::default_delete<FixedBuffer<4096ul>>>>>
  ::emplace_back<std::unique_ptr<FixedBuffer<4096ul>,std::default_delete<FixedBuffer<4096ul>>>>
            ((vector<std::unique_ptr<FixedBuffer<4096ul>,std::default_delete<FixedBuffer<4096ul>>>,std::allocator<std::unique_ptr<FixedBuffer<4096ul>,std::default_delete<FixedBuffer<4096ul>>>>>
              *)this_00,this_01);
  uVar6 = 0;
  while( true ) {
    puVar1 = (this->m_buffers).
             super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pLVar2 = (this->m_logFilePtr)._M_t.super___uniq_ptr_impl<LogFile,_std::default_delete<LogFile>_>
             ._M_t.super__Tuple_impl<0UL,_LogFile_*,_std::default_delete<LogFile>_>.
             super__Head_base<0UL,_LogFile_*,_false>._M_head_impl;
    if ((ulong)((long)(this->m_buffers).
                      super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3) <= uVar6)
    break;
    data_00._M_t.
    super__Tuple_impl<0UL,_FixedBuffer<4096UL>_*,_std::default_delete<FixedBuffer<4096UL>_>_>.
    super__Head_base<0UL,_FixedBuffer<4096UL>_*,_false>._M_head_impl =
         puVar1[uVar6]._M_t.
         super___uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>._M_t
    ;
    *(char *)((long)data_00._M_t.
                    super__Tuple_impl<0UL,_FixedBuffer<4096UL>_*,_std::default_delete<FixedBuffer<4096UL>_>_>
                    .super__Head_base<0UL,_FixedBuffer<4096UL>_*,_false>._M_head_impl +
             *(long *)((long)data_00._M_t.
                             super__Tuple_impl<0UL,_FixedBuffer<4096UL>_*,_std::default_delete<FixedBuffer<4096UL>_>_>
                             .super__Head_base<0UL,_FixedBuffer<4096UL>_*,_false>._M_head_impl +
                      0x1000)) = '\0';
    LogFile::Append(pLVar2,(char *)data_00._M_t.
                                   super__Tuple_impl<0UL,_FixedBuffer<4096UL>_*,_std::default_delete<FixedBuffer<4096UL>_>_>
                                   .super__Head_base<0UL,_FixedBuffer<4096UL>_*,_false>._M_head_impl
                    ,*(size_t *)
                      ((long)(this_00->
                             super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[uVar6]._M_t.
                             super___uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>
                      + 0x1000));
    uVar6 = uVar6 + 1;
  }
  LogFile::Flush(pLVar2);
  LockGuard::~LockGuard(&lock);
  std::
  vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
  ::~vector(&local_48);
  std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>::~unique_ptr
            (&secondBuffer);
  std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>::~unique_ptr
            (&firstBuffer);
  return;
}

Assistant:

void AsyncLog::ThreadFunc()
{
	BufferPtr firstBuffer(new Buffer);
	BufferPtr secondBuffer(new Buffer);
	std::vector<BufferPtr> vecWriteBuffers;
	vecWriteBuffers.reserve(16);
	{
		LockGuard lock(*m_mutex);
		m_mainThreadRunCond->Notify();
	}
	//std::cout << "Sub thread, " << __LINE__ << " Running " << std::endl;
	while(m_bRunning)
	{
		{
			LockGuard lock(*m_mutex);
			if (m_buffers.empty())
			{
				//std::cout << "Sub thread, wait for Condition, " << __LINE__ << std::endl;
				m_subThreadFlushCond->WaitForSeconds(3);
				//m_subThreadFlushCond.Wait();
			}
			//std::cout << "Sub thread, " << __LINE__ << " Buffer size, " <<m_buffers.size() << std::endl;
			
			m_buffers.push_back(std::move(m_curBuff));
			m_curBuff = std::move(firstBuffer);
			m_curBuff->Reset();
			if (!m_nextBuff)
			{
				m_nextBuff = std::move(secondBuffer);
				m_nextBuff->Reset();
			}
			
			m_buffers.swap(vecWriteBuffers);
			m_buffers.clear();
		}
		
		for (size_t i = 0; i < vecWriteBuffers.size(); ++i)
		{
			m_logFilePtr->Append(vecWriteBuffers[i]->Data(), vecWriteBuffers[i]->Size());
		}
		
		firstBuffer = std::move(vecWriteBuffers[0]);
		if (2 <= vecWriteBuffers.size())
		{
			secondBuffer = std::move(vecWriteBuffers[1]);
		}
		vecWriteBuffers.clear();
		m_logFilePtr->Flush();
	}

	// push data in buffer to the log file
	LockGuard lock(*m_mutex);
	m_buffers.push_back(std::move(m_curBuff));
	for (size_t i = 0; i < m_buffers.size(); ++i)
	{
		m_logFilePtr->Append(m_buffers[i]->Data(), m_buffers[i]->Size());
	}
	m_logFilePtr->Flush();
}